

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

void __thiscall QCborValue::QCborValue(QCborValue *this,QUuid *uuid)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_48;
  QCborValue local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QUuid::toRfc4122((QByteArray *)&QStack_48,uuid);
  QCborValue((QCborValue *)&local_30,(QByteArray *)&QStack_48);
  QCborValue(this,0x25,&local_30);
  ~QCborValue((QCborValue *)&local_30);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48);
  *(undefined4 *)(this + 0x10) = 0x10025;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue::QCborValue(const QUuid &uuid)
    : QCborValue(QCborKnownTags::Uuid, uuid.toRfc4122())
{
    // change our type
    t = Uuid;
}